

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O0

void __thiscall toml::detail::syntax::non_ascii::non_ascii(non_ascii *this,spec *s)

{
  sequence *in_RDI;
  spec *in_stack_000000d8;
  spec *in_stack_00000108;
  sequence *in_stack_ffffffffffffff98;
  sequence *in_stack_ffffffffffffffa0;
  sequence *in_stack_ffffffffffffffa8;
  either *in_stack_ffffffffffffffb0;
  spec *in_stack_ffffffffffffffc8;
  
  scanner_base::scanner_base(&in_RDI->super_scanner_base);
  (in_RDI->super_scanner_base)._vptr_scanner_base = (_func_int **)&PTR__non_ascii_009655e0;
  utf8_2bytes(in_stack_ffffffffffffffc8);
  utf8_3bytes(in_stack_00000108);
  utf8_4bytes(in_stack_000000d8);
  either::either<toml::detail::sequence,toml::detail::sequence,toml::detail::sequence>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98);
  sequence::~sequence(in_RDI);
  sequence::~sequence(in_RDI);
  sequence::~sequence(in_RDI);
  return;
}

Assistant:

TOML11_INLINE non_ascii::non_ascii(const spec& s) noexcept
    : scanner_(utf8_2bytes(s), utf8_3bytes(s), utf8_4bytes(s))
{}